

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_stroke_curve(nk_command_buffer *b,float ax,float ay,float ctrl0x,float ctrl0y,float ctrl1x,
                    float ctrl1y,float bx,float by,float line_thickness,nk_color col)

{
  void *pvVar1;
  nk_command_curve *cmd;
  float by_local;
  float bx_local;
  float ctrl1y_local;
  float ctrl1x_local;
  float ctrl0y_local;
  float ctrl0x_local;
  float ay_local;
  float ax_local;
  nk_command_buffer *b_local;
  nk_color col_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x2287,
                  "void nk_stroke_curve(struct nk_command_buffer *, float, float, float, float, float, float, float, float, float, struct nk_color)"
                 );
  }
  if ((((b != (nk_command_buffer *)0x0) && (b_local._7_1_ = col.a, b_local._7_1_ != '\0')) &&
      (0.0 < line_thickness)) &&
     (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_CURVE,0x28), pvVar1 != (void *)0x0)) {
    *(short *)((long)pvVar1 + 0x10) = (short)(int)line_thickness;
    *(short *)((long)pvVar1 + 0x12) = (short)(int)ax;
    *(short *)((long)pvVar1 + 0x14) = (short)(int)ay;
    *(short *)((long)pvVar1 + 0x1a) = (short)(int)ctrl0x;
    *(short *)((long)pvVar1 + 0x1c) = (short)(int)ctrl0y;
    *(short *)((long)pvVar1 + 0x1e) = (short)(int)ctrl1x;
    *(short *)((long)pvVar1 + 0x20) = (short)(int)ctrl1y;
    *(short *)((long)pvVar1 + 0x16) = (short)(int)bx;
    *(short *)((long)pvVar1 + 0x18) = (short)(int)by;
    *(nk_color *)((long)pvVar1 + 0x22) = col;
  }
  return;
}

Assistant:

NK_API void
nk_stroke_curve(struct nk_command_buffer *b, float ax, float ay,
    float ctrl0x, float ctrl0y, float ctrl1x, float ctrl1y,
    float bx, float by, float line_thickness, struct nk_color col)
{
    struct nk_command_curve *cmd;
    NK_ASSERT(b);
    if (!b || col.a == 0 || line_thickness <= 0) return;

    cmd = (struct nk_command_curve*)
        nk_command_buffer_push(b, NK_COMMAND_CURVE, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->begin.x = (short)ax;
    cmd->begin.y = (short)ay;
    cmd->ctrl[0].x = (short)ctrl0x;
    cmd->ctrl[0].y = (short)ctrl0y;
    cmd->ctrl[1].x = (short)ctrl1x;
    cmd->ctrl[1].y = (short)ctrl1y;
    cmd->end.x = (short)bx;
    cmd->end.y = (short)by;
    cmd->color = col;
}